

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O0

int proxy_h2_fr_print(nghttp2_frame *frame,char *buffer,size_t blen)

{
  size_t local_c8;
  size_t len;
  size_t s_len;
  char scratch [128];
  size_t blen_local;
  char *buffer_local;
  nghttp2_frame *frame_local;
  
  scratch._120_8_ = blen;
  switch((frame->hd).type) {
  case '\0':
    frame_local._4_4_ =
         curl_msnprintf(buffer,blen,"FRAME[DATA, len=%d, eos=%d, padlen=%d]",
                        (frame->hd).length & 0xffffffff,(ulong)(((frame->hd).flags & 1) != 0),
                        (frame->data).padlen & 0xffffffff);
    break;
  case '\x01':
    frame_local._4_4_ =
         curl_msnprintf(buffer,blen,"FRAME[HEADERS, len=%d, hend=%d, eos=%d]",
                        (frame->hd).length & 0xffffffff,(ulong)(((frame->hd).flags & 4) != 0),
                        (ulong)(((frame->hd).flags & 1) != 0));
    break;
  case '\x02':
    frame_local._4_4_ =
         curl_msnprintf(buffer,blen,"FRAME[PRIORITY, len=%d, flags=%d]",
                        (frame->hd).length & 0xffffffff,(ulong)(frame->hd).flags);
    break;
  case '\x03':
    frame_local._4_4_ =
         curl_msnprintf(buffer,blen,"FRAME[RST_STREAM, len=%d, flags=%d, error=%u]",
                        (frame->hd).length & 0xffffffff,(ulong)(frame->hd).flags,
                        (ulong)(frame->rst_stream).error_code);
    break;
  case '\x04':
    if (((frame->hd).flags & 1) == 0) {
      frame_local._4_4_ =
           curl_msnprintf(buffer,blen,"FRAME[SETTINGS, len=%d]",(frame->hd).length & 0xffffffff);
    }
    else {
      frame_local._4_4_ = curl_msnprintf(buffer,blen,"FRAME[SETTINGS, ack=1]");
    }
    break;
  case '\x05':
    frame_local._4_4_ =
         curl_msnprintf(buffer,blen,"FRAME[PUSH_PROMISE, len=%d, hend=%d]",
                        (frame->hd).length & 0xffffffff,(ulong)(((frame->hd).flags & 4) != 0));
    break;
  case '\x06':
    frame_local._4_4_ =
         curl_msnprintf(buffer,blen,"FRAME[PING, len=%d, ack=%d]",(frame->hd).length & 0xffffffff,
                        (ulong)((frame->hd).flags & 1));
    break;
  case '\a':
    if ((frame->push_promise).nvlen < 0x80) {
      local_c8 = (frame->push_promise).nvlen;
    }
    else {
      local_c8 = 0x7f;
    }
    if (local_c8 != 0) {
      memcpy(&s_len,(frame->settings).iv,local_c8);
    }
    scratch[local_c8 - 8] = '\0';
    frame_local._4_4_ =
         curl_msnprintf(buffer,scratch._120_8_,
                        "FRAME[GOAWAY, error=%d, reason=\'%s\', last_stream=%d]",
                        (ulong)(frame->goaway).error_code,&s_len,
                        (ulong)(frame->rst_stream).error_code);
    break;
  case '\b':
    frame_local._4_4_ =
         curl_msnprintf(buffer,blen,"FRAME[WINDOW_UPDATE, incr=%d]",
                        (ulong)(frame->rst_stream).error_code);
    break;
  default:
    frame_local._4_4_ =
         curl_msnprintf(buffer,blen,"FRAME[%d, len=%d, flags=%d]",(ulong)(frame->hd).type,
                        (frame->hd).length & 0xffffffff,(ulong)(frame->hd).flags);
  }
  return frame_local._4_4_;
}

Assistant:

static int proxy_h2_fr_print(const nghttp2_frame *frame,
                             char *buffer, size_t blen)
{
  switch(frame->hd.type) {
    case NGHTTP2_DATA: {
      return msnprintf(buffer, blen,
                       "FRAME[DATA, len=%d, eos=%d, padlen=%d]",
                       (int)frame->hd.length,
                       !!(frame->hd.flags & NGHTTP2_FLAG_END_STREAM),
                       (int)frame->data.padlen);
    }
    case NGHTTP2_HEADERS: {
      return msnprintf(buffer, blen,
                       "FRAME[HEADERS, len=%d, hend=%d, eos=%d]",
                       (int)frame->hd.length,
                       !!(frame->hd.flags & NGHTTP2_FLAG_END_HEADERS),
                       !!(frame->hd.flags & NGHTTP2_FLAG_END_STREAM));
    }
    case NGHTTP2_PRIORITY: {
      return msnprintf(buffer, blen,
                       "FRAME[PRIORITY, len=%d, flags=%d]",
                       (int)frame->hd.length, frame->hd.flags);
    }
    case NGHTTP2_RST_STREAM: {
      return msnprintf(buffer, blen,
                       "FRAME[RST_STREAM, len=%d, flags=%d, error=%u]",
                       (int)frame->hd.length, frame->hd.flags,
                       frame->rst_stream.error_code);
    }
    case NGHTTP2_SETTINGS: {
      if(frame->hd.flags & NGHTTP2_FLAG_ACK) {
        return msnprintf(buffer, blen, "FRAME[SETTINGS, ack=1]");
      }
      return msnprintf(buffer, blen,
                       "FRAME[SETTINGS, len=%d]", (int)frame->hd.length);
    }
    case NGHTTP2_PUSH_PROMISE: {
      return msnprintf(buffer, blen,
                       "FRAME[PUSH_PROMISE, len=%d, hend=%d]",
                       (int)frame->hd.length,
                       !!(frame->hd.flags & NGHTTP2_FLAG_END_HEADERS));
    }
    case NGHTTP2_PING: {
      return msnprintf(buffer, blen,
                       "FRAME[PING, len=%d, ack=%d]",
                       (int)frame->hd.length,
                       frame->hd.flags&NGHTTP2_FLAG_ACK);
    }
    case NGHTTP2_GOAWAY: {
      char scratch[128];
      size_t s_len = sizeof(scratch)/sizeof(scratch[0]);
        size_t len = (frame->goaway.opaque_data_len < s_len)?
                      frame->goaway.opaque_data_len : s_len-1;
        if(len)
          memcpy(scratch, frame->goaway.opaque_data, len);
        scratch[len] = '\0';
        return msnprintf(buffer, blen, "FRAME[GOAWAY, error=%d, reason='%s', "
                         "last_stream=%d]", frame->goaway.error_code,
                         scratch, frame->goaway.last_stream_id);
    }
    case NGHTTP2_WINDOW_UPDATE: {
      return msnprintf(buffer, blen,
                       "FRAME[WINDOW_UPDATE, incr=%d]",
                       frame->window_update.window_size_increment);
    }
    default:
      return msnprintf(buffer, blen, "FRAME[%d, len=%d, flags=%d]",
                       frame->hd.type, (int)frame->hd.length,
                       frame->hd.flags);
  }
}